

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::
TPZGeoElRefPattern(TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                   *this)

{
  *(undefined ***)
   &(this->super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>).
    super_TPZGeoEl = &PTR__TPZSavable_016def10;
  TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::TPZGeoElRefLess
            (&this->
              super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
             ,&PTR_PTR_016de800);
  *(undefined ***)
   &(this->super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>).
    super_TPZGeoEl = &PTR__TPZGeoElRefPattern_016de500;
  TPZVec<long>::TPZVec(&this->fSubEl,0);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(&this->fRefPattern,(TPZRefPattern *)0x0);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}